

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::BorderAmounts_EdgeSizes
          (BorderAmounts_EdgeSizes *this,BorderAmounts_EdgeSizes *from)

{
  ulong uVar1;
  uint64_t uVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BorderAmounts_EdgeSizes_00488108
  ;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  uVar2 = from->endedgesize_;
  this->startedgesize_ = from->startedgesize_;
  this->endedgesize_ = uVar2;
  return;
}

Assistant:

BorderAmounts_EdgeSizes::BorderAmounts_EdgeSizes(const BorderAmounts_EdgeSizes& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&startedgesize_, &from.startedgesize_,
    static_cast<size_t>(reinterpret_cast<char*>(&endedgesize_) -
    reinterpret_cast<char*>(&startedgesize_)) + sizeof(endedgesize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BorderAmounts.EdgeSizes)
}